

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  int *piVar1;
  _func_int **pp_Var2;
  int iVar3;
  cmCTestTestProperties *pcVar4;
  cmCTest *pcVar5;
  cmCTestTestHandler *this_00;
  cmProcess *this_01;
  bool bVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  ostream *poVar10;
  long *plVar11;
  long lVar12;
  char cVar13;
  pointer ppVar14;
  char *pcVar15;
  char *pcVar16;
  byte bVar17;
  double dVar18;
  string reason;
  ostringstream cmCTestLog_msg;
  char buf [1024];
  string local_5f8;
  char *local_5d8;
  char *local_5d0;
  char local_5c8;
  undefined7 uStack_5c7;
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8 [6];
  ios_base local_548 [272];
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [6];
  ios_base local_3c8 [920];
  
  if (((this->TestHandler->MemCheck == false) &&
      (bVar6 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar6)) ||
     ((this->TestHandler->MemCheck == true &&
      (bVar6 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar6)))) {
    CompressOutput(this);
  }
  WriteLogOutputTop(this,completed,total);
  local_5d8 = &local_5c8;
  local_5d0 = (char *)0x0;
  local_5c8 = '\0';
  iVar8 = 1;
  if (started) {
    iVar8 = cmProcess::GetProcessStatus(this->TestProcess);
  }
  iVar3 = this->TestProcess->ExitValue;
  ppVar14 = (this->TestProperties->RequiredRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar6 = false;
  if ((ppVar14 !=
       (this->TestProperties->RequiredRegularExpressions).
       super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    for (; ppVar14 !=
           (this->TestProperties->RequiredRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppVar14 = ppVar14 + 1) {
      bVar6 = cmsys::RegularExpression::find(&ppVar14->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      if (bVar6) {
        bVar6 = false;
        std::__cxx11::string::_M_replace((ulong)&local_5d8,0,local_5d0,0x6399f6);
        goto LAB_00323545;
      }
    }
    bVar6 = true;
    std::__cxx11::string::_M_replace((ulong)&local_5d8,0,local_5d0,0x639a19);
LAB_00323545:
    std::__cxx11::string::append((char *)&local_5d8);
    ppVar14 = (this->TestProperties->RequiredRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar14 !=
        (this->TestProperties->RequiredRegularExpressions).
        super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_5d8,(ulong)(ppVar14->second)._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_5d8);
        ppVar14 = ppVar14 + 1;
      } while (ppVar14 !=
               (this->TestProperties->RequiredRegularExpressions).
               super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::append((char *)&local_5d8);
  }
  ppVar14 = (this->TestProperties->ErrorRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ppVar14 !=
       (this->TestProperties->ErrorRegularExpressions).
       super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    for (; ppVar14 !=
           (this->TestProperties->ErrorRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppVar14 = ppVar14 + 1) {
      bVar7 = cmsys::RegularExpression::find(&ppVar14->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      if (bVar7) {
        std::__cxx11::string::_M_replace((ulong)&local_5d8,0,local_5d0,0x639a40);
        std::__cxx11::string::append((char *)&local_5d8);
        std::__cxx11::string::_M_append
                  ((char *)&local_5d8,(ulong)(ppVar14->second)._M_dataplus._M_p);
        bVar6 = true;
        std::__cxx11::string::append((char *)&local_5d8);
        break;
      }
    }
  }
  if (iVar8 == 2) {
    cVar13 = this->CTest->OutputTestOutputOnTestFailure;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Exception: ",0xe);
    pcVar5 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xef,(char *)local_5b8._0_8_,false);
    pp_Var2 = (_func_int **)(local_5b8 + 0x10);
    if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
      operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    cmProcess::GetExitExceptionString_abi_cxx11_((string *)local_438,this->TestProcess);
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).ExceptionStatus,(string *)local_438);
    if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    iVar8 = cmProcess::GetExitException(this->TestProcess);
    switch(iVar8) {
    case 1:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"SegFault",8);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf4,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 2;
      break;
    case 2:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Illegal",7);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf8,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 3;
      break;
    case 3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Interrupt",9);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfc,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 4;
      break;
    case 4:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Numerical",9);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x100,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_438,(this->TestResult).ExceptionStatus._M_dataplus._M_p,
                 (this->TestResult).ExceptionStatus._M_string_length);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x105,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 6;
    }
  }
  else if (iVar8 == 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Timeout ",0xb);
    pcVar5 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xea,(char *)local_5b8._0_8_,false);
    if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
      operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    (this->TestResult).Status = 1;
LAB_00323728:
    cVar13 = this->CTest->OutputTestOutputOnTestFailure;
  }
  else {
    if (iVar8 == 4) {
      if (bVar6) {
        bVar6 = false;
      }
      else if (iVar3 == 0) {
        bVar6 = true;
      }
      else {
        bVar6 = (this->TestProperties->RequiredRegularExpressions).
                super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (this->TestProperties->RequiredRegularExpressions).
                super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      }
      pcVar4 = this->TestProperties;
      if (pcVar4->SkipReturnCode == iVar3 && -1 < pcVar4->SkipReturnCode) {
        (this->TestResult).Status = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,"SKIP_RETURN_CODE=",0x11);
        std::ostream::operator<<(local_438,this->TestProperties->SkipReturnCode);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).CompletionStatus,(string *)local_5b8);
        if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
          operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"***Skipped ",0xb);
        pcVar5 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xde,local_5f8._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
        std::ios_base::~ios_base(local_548);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
        std::ios_base::~ios_base(local_3c8);
        bVar17 = 1;
        cVar13 = '\0';
        goto LAB_00323ea6;
      }
      if (bVar6) {
        if (pcVar4->WillFail == true) {
          if (!bVar6) goto LAB_00323df1;
          goto LAB_00324597;
        }
      }
      else {
LAB_00323df1:
        if (pcVar4->WillFail != true) {
LAB_00324597:
          (this->TestResult).Status = 7;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Failed  ",0xb)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,local_5d8,(long)local_5d0);
          pcVar5 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0xe6,(char *)local_5b8._0_8_,false);
          if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
            operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
          std::ios_base::~ios_base(local_3c8);
          goto LAB_00323728;
        }
      }
      (this->TestResult).Status = 9;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"   Passed  ",0xb);
      pcVar5 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xe3,(char *)local_5b8._0_8_,false);
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)&(this->TestResult).CompletionStatus);
      if (iVar8 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,"***Not Run (Disabled) ",0x16);
        pcVar5 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x109,(char *)local_5b8._0_8_,false);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Not Run ",0xb);
        pcVar5 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x10c,(char *)local_5b8._0_8_,false);
      }
    }
    if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
      operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    cVar13 = '\0';
  }
  bVar17 = 0;
LAB_00323ea6:
  iVar8 = (this->TestResult).Status;
  sprintf(local_438,"%6.2f sec",this->TestProcess->TotalTime);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
  sVar9 = strlen(local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,local_438,sVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"\n",1);
  pcVar5 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x112,local_5f8._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
  std::ios_base::~ios_base(local_548);
  if (cVar13 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5b8,(this->ProcessOutput)._M_dataplus._M_p,
                         (this->ProcessOutput)._M_string_length);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    pcVar5 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar5,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x115,local_5f8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
    std::ios_base::~ios_base(local_548);
  }
  poVar10 = this->TestHandler->LogFile;
  if (poVar10 != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Test time = ",0xc);
    sVar9 = strlen(local_438);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_438,sVar9);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  cmWorkingDirectory::cmWorkingDirectory
            ((cmWorkingDirectory *)local_5b8,&this->TestProperties->Directory);
  DartProcessing(this);
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_5b8);
  if ((started) && (this_00 = this->TestHandler, this_00->MemCheck == false)) {
    cmCTestTestHandler::CleanTestOutput
              (this_00,&this->ProcessOutput,
               (long)(&this_00->CustomMaximumPassedTestOutputSize)[(this->TestResult).Status != 9]);
  }
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Reason);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    iVar3 = (this->TestResult).Status;
    pcVar16 = "Test Pass Reason";
    pcVar15 = "Test Passed.\n";
    if ((iVar3 != 0) && (iVar3 != 9)) {
      pcVar16 = "Test Fail Reason";
      pcVar15 = "Test Failed.\n";
    }
    dVar18 = this->TestProcess->TotalTime;
    sprintf(local_5b8,"%02d:%02d:%02d",(ulong)(uint)(int)(dVar18 / 3600.0),
            (ulong)(uint)((int)(dVar18 / 60.0) % 0x3c),(ulong)(uint)((int)dVar18 % 0x3c));
    poVar10 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    poVar10 = this->TestHandler->LogFile;
    if ((this->TestResult).Reason._M_string_length == 0) {
      lVar12 = 0xd;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar16,0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,":\n",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(this->TestResult).Reason._M_dataplus._M_p,
                           (this->TestResult).Reason._M_string_length);
      lVar12 = 1;
      pcVar15 = "\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar12);
    poVar10 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" end time: ",0xc);
    cmCTest::CurrentTime_abi_cxx11_(&local_5f8,this->CTest);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_5f8._M_dataplus._M_p,local_5f8._M_string_length);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    poVar10 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" time elapsed: ",0x10);
    sVar9 = strlen(local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_5b8,sVar9);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    poVar10 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    plVar11 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
  }
  if (started) {
    bVar6 = false;
    if ((this->TestHandler->MemCheck == false) &&
       (bVar6 = false, this->CompressionRatio <= 1.0 && this->CompressionRatio != 1.0)) {
      bVar6 = cmCTest::ShouldCompressTestOutput(this->CTest);
    }
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).CompressOutput = bVar6;
    (this->TestResult).ReturnValue = this->TestProcess->ExitValue;
    if (bVar17 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->TestResult).CompletionStatus,0,
                 (char *)(this->TestResult).CompletionStatus._M_string_length,0x63639a);
    }
    (this->TestResult).ExecutionTime = this->TestProcess->TotalTime;
    MemCheckPostProcess(this);
    if ((this->TestResult).Status == 9) {
      pcVar4 = this->TestProperties;
      dVar18 = (double)pcVar4->PreviousRuns;
      pcVar4->Cost = (float)(((double)pcVar4->Cost * dVar18 + (this->TestResult).ExecutionTime) /
                            (dVar18 + 1.0));
      pcVar4->PreviousRuns = pcVar4->PreviousRuns + 1;
    }
  }
  piVar1 = &this->NumberOfRunsLeft;
  *piVar1 = *piVar1 + -1;
  if (((*piVar1 == 0) || (this->RunUntilFail != true)) || ((this->TestResult).Status != 9)) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  else {
    this->RunAgain = true;
  }
  this_01 = this->TestProcess;
  if (this_01 != (cmProcess *)0x0) {
    cmProcess::~cmProcess(this_01);
    operator_delete(this_01,0xc0);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8,CONCAT71(uStack_5c7,local_5c8) + 1);
  }
  return (bool)(bVar17 | iVar8 == 9);
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  if ((!this->TestHandler->MemCheck &&
       this->CTest->ShouldCompressTestOutput()) ||
      (this->TestHandler->MemCheck &&
       this->CTest->ShouldCompressTestOutput())) {
    this->CompressOutput();
  }

  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  int res =
    started ? this->TestProcess->GetProcessStatus() : cmsysProcess_State_Error;
  int retVal = this->TestProcess->GetExitValue();
  std::vector<std::pair<cmsys::RegularExpression, std::string> >::iterator
    passIt;
  bool forceFail = false;
  bool skipped = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    bool found = false;
    for (passIt = this->TestProperties->RequiredRegularExpressions.begin();
         passIt != this->TestProperties->RequiredRegularExpressions.end();
         ++passIt) {
      if (passIt->first.find(this->ProcessOutput.c_str())) {
        found = true;
        reason = "Required regular expression found.";
        break;
      }
    }
    if (!found) {
      reason = "Required regular expression not found.";
      forceFail = true;
    }
    reason += "Regex=[";
    for (passIt = this->TestProperties->RequiredRegularExpressions.begin();
         passIt != this->TestProperties->RequiredRegularExpressions.end();
         ++passIt) {
      reason += passIt->second;
      reason += "\n";
    }
    reason += "]";
  }
  if (!this->TestProperties->ErrorRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (passIt = this->TestProperties->ErrorRegularExpressions.begin();
         passIt != this->TestProperties->ErrorRegularExpressions.end();
         ++passIt) {
      if (passIt->first.find(this->ProcessOutput.c_str())) {
        reason = "Error regular expression found in output.";
        reason += " Regex=[";
        reason += passIt->second;
        reason += "]";
        forceFail = true;
        break;
      }
    }
  }
  if (res == cmsysProcess_State_Exited) {
    bool success = !forceFail &&
      (retVal == 0 ||
       !this->TestProperties->RequiredRegularExpressions.empty());
    if (this->TestProperties->SkipReturnCode >= 0 &&
        this->TestProperties->SkipReturnCode == retVal) {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      std::ostringstream s;
      s << "SKIP_RETURN_CODE=" << this->TestProperties->SkipReturnCode;
      this->TestResult.CompletionStatus = s.str();
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Skipped ");
      skipped = true;
    } else if ((success && !this->TestProperties->WillFail) ||
               (!success && this->TestProperties->WillFail)) {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Passed  ");
    } else {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Failed  " << reason);
      outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    }
  } else if (res == cmsysProcess_State_Expired) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Timeout ");
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
  } else if (res == cmsysProcess_State_Exception) {
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Exception: ");
    this->TestResult.ExceptionStatus =
      this->TestProcess->GetExitExceptionString();
    switch (this->TestProcess->GetExitException()) {
      case cmsysProcess_Exception_Fault:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "SegFault");
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmsysProcess_Exception_Illegal:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Illegal");
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmsysProcess_Exception_Interrupt:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Interrupt");
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmsysProcess_Exception_Numerical:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Numerical");
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT,
                   this->TestResult.ExceptionStatus);
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
    }
  } else if ("Disabled" == this->TestResult.CompletionStatus) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run (Disabled) ");
  } else // cmsysProcess_State_Error
  {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run ");
  }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  sprintf(buf, "%6.2f sec", this->TestProcess->GetTotalTime());
  cmCTestLog(this->CTest, HANDLER_OUTPUT, buf << "\n");

  if (outputTestErrorsToConsole) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl);
  }

  if (this->TestHandler->LogFile) {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
  }

  // Set the working directory to the tests directory to process Dart files.
  {
    cmWorkingDirectory workdir(this->TestProperties->Directory);
    this->DartProcessing();
  }

  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if (!this->TestHandler->MemCheck && started) {
    this->TestHandler->CleanTestOutput(
      this->ProcessOutput,
      static_cast<size_t>(
        this->TestResult.Status == cmCTestTestHandler::COMPLETED
          ? this->TestHandler->CustomMaximumPassedTestOutputSize
          : this->TestHandler->CustomMaximumFailedTestOutputSize));
  }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile) {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if (this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
        this->TestResult.Status != cmCTestTestHandler::NOT_RUN) {
      reasonType = "Test Fail Reason";
      pass = false;
    }
    double ttime = this->TestProcess->GetTotalTime();
    int hours = static_cast<int>(ttime / (60 * 60));
    int minutes = static_cast<int>(ttime / 60) % 60;
    int seconds = static_cast<int>(ttime) % 60;
    char buffer[100];
    sprintf(buffer, "%02d:%02d:%02d", hours, minutes, seconds);
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if (!this->TestResult.Reason.empty()) {
      *this->TestHandler->LogFile << reasonType << ":\n"
                                  << this->TestResult.Reason << "\n";
    } else {
      if (pass) {
        *this->TestHandler->LogFile << "Test Passed.\n";
      } else {
        *this->TestHandler->LogFile << "Test Failed.\n";
      }
    }
    *this->TestHandler->LogFile
      << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: " << buffer
      << std::endl
      << "----------------------------------------------------------"
      << std::endl
      << std::endl;
  }
  // if the test actually started and ran
  // record the results in TestResult
  if (started) {
    bool compress = !this->TestHandler->MemCheck &&
      this->CompressionRatio < 1 && this->CTest->ShouldCompressTestOutput();
    this->TestResult.Output =
      compress ? this->CompressedOutput : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    if (!skipped) {
      this->TestResult.CompletionStatus = "Completed";
    }
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
  }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if (!this->NeedsToRerun()) {
    this->TestHandler->TestResults.push_back(this->TestResult);
  }
  delete this->TestProcess;
  return passed || skipped;
}